

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

int kvtree_sort_int(kvtree *hash,int direction)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem_struct **ppkVar2;
  int iVar3;
  kvtree_elem_struct *pkVar4;
  void *__base;
  ulong uVar5;
  code *__compar;
  long *plVar6;
  undefined8 *puVar7;
  size_t size;
  uint uVar8;
  size_t __nmemb;
  sort_elem_int *list;
  void *local_40;
  int local_34;
  
  if (hash == (kvtree *)0x0) {
    __nmemb = 0;
    local_40 = kvtree_malloc(0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                             ,0x26b);
  }
  else {
    pkVar4 = hash->lh_first;
    if (pkVar4 == (kvtree_elem_struct *)0x0) {
      __nmemb = 0;
      __base = kvtree_malloc(0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                             ,0x26b);
    }
    else {
      size = 0;
      __nmemb = 0;
      do {
        pkVar4 = (pkVar4->pointers).le_next;
        __nmemb = __nmemb + 1;
        size = size + 0x10;
      } while (pkVar4 != (kvtree_elem_struct *)0x0);
      __base = kvtree_malloc(size,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                             ,0x26b);
      local_40 = __base;
      if (hash == (kvtree *)0x0) goto LAB_0010450f;
    }
    pkVar4 = hash->lh_first;
    local_40 = __base;
    if (pkVar4 != (kvtree_elem_struct *)0x0) {
      puVar7 = (undefined8 *)((long)__base + 8);
      uVar8 = 0;
      local_34 = direction;
      do {
        iVar3 = atoi(pkVar4->key);
        *(int *)(puVar7 + -1) = iVar3;
        *puVar7 = pkVar4;
        pkVar4 = (pkVar4->pointers).le_next;
        puVar7 = puVar7 + 2;
        uVar8 = uVar8 + 1;
        direction = local_34;
      } while (pkVar4 != (kvtree_elem_struct *)0x0);
      goto LAB_00104512;
    }
  }
LAB_0010450f:
  uVar8 = 0;
  __base = local_40;
LAB_00104512:
  __compar = kvtree_cmp_fn_int_asc;
  if (direction == 1) {
    __compar = kvtree_cmp_fn_int_desc;
  }
  qsort(__base,__nmemb,0x10,__compar);
  if (0 < (int)uVar8) {
    uVar5 = (ulong)uVar8 + 1;
    plVar6 = (long *)((long)__base + (ulong)uVar8 * 0x10 + -8);
    do {
      pkVar4 = (kvtree_elem_struct *)*plVar6;
      pkVar1 = (pkVar4->pointers).le_next;
      ppkVar2 = (pkVar4->pointers).le_prev;
      if (pkVar1 != (kvtree_elem_struct *)0x0) {
        (pkVar1->pointers).le_prev = ppkVar2;
      }
      *ppkVar2 = pkVar1;
      pkVar1 = hash->lh_first;
      (pkVar4->pointers).le_next = pkVar1;
      if (pkVar1 != (kvtree_elem_struct *)0x0) {
        (pkVar1->pointers).le_prev = &(pkVar4->pointers).le_next;
      }
      hash->lh_first = pkVar4;
      (pkVar4->pointers).le_prev = &hash->lh_first;
      uVar5 = uVar5 - 1;
      plVar6 = plVar6 + -2;
    } while (1 < uVar5);
  }
  kvtree_free(&local_40);
  return 0;
}

Assistant:

int kvtree_sort_int(kvtree* hash, int direction)
{
  /* get the size of the hash */
  int count = kvtree_size(hash);

  /* allocate space for each element */
  struct sort_elem_int* list = (struct sort_elem_int*) KVTREE_MALLOC(count * sizeof(struct sort_elem_int));

  /* walk the hash and fill in the keys */
  kvtree_elem* elem = NULL;
  int index = 0;
  for (elem = kvtree_elem_first(hash);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    int key = kvtree_elem_key_int(elem);
    list[index].key = key;
    list[index].addr = elem;
    index++;
  }

  /* sort the elements by key */
  int (*fn)(const void* a, const void* b) = NULL;
  fn = &kvtree_cmp_fn_int_asc;
  if (direction == KVTREE_SORT_DESCENDING) {
    fn = &kvtree_cmp_fn_int_desc;
  }
  qsort(list, count, sizeof(struct sort_elem_int), fn);

  /* walk the sorted list backwards, extracting the element by address,
   * and inserting at the head */
  while (index > 0) {
    index--;
    elem = list[index].addr;
    LIST_REMOVE(elem, pointers);
    LIST_INSERT_HEAD(hash, elem, pointers);
  }

  /* free the list */
  kvtree_free(&list);

  return KVTREE_SUCCESS;
}